

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line_test.cpp
# Opt level: O0

void license::test::create_project
               (path *projects_folder,path *expectedPrivateKey,path *expected_public_key,
               path *mock_source_folder,string *project_name)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  string *psVar4;
  basic_cstring<const_char> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_390;
  assertion_result local_370;
  basic_cstring<const_char> local_358;
  basic_cstring<const_char> local_348;
  basic_cstring<const_char> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2e8;
  assertion_result local_2c8;
  basic_cstring<const_char> local_2b0;
  basic_cstring<const_char> local_2a0;
  undefined4 local_28c;
  basic_cstring<const_char> local_288;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_278;
  basic_cstring<const_char> local_250;
  basic_cstring<const_char> local_240;
  int local_22c;
  char *pcStack_228;
  int result;
  char *argv1 [9];
  string local_1d0 [4];
  int argc;
  string projects_str;
  string mock_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_140;
  assertion_result local_120;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  basic_cstring<const_char> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_88;
  assertion_result local_68;
  basic_cstring<const_char> local_50;
  basic_cstring<const_char> local_40;
  string *local_30;
  string *project_name_local;
  path *mock_source_folder_local;
  path *expected_public_key_local;
  path *expectedPrivateKey_local;
  path *projects_folder_local;
  
  local_30 = project_name;
  project_name_local = &mock_source_folder->m_pathname;
  mock_source_folder_local = expected_public_key;
  expected_public_key_local = expectedPrivateKey;
  expectedPrivateKey_local = projects_folder;
  boost::filesystem::remove_all(projects_folder);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
               ,0x8c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_50);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_40,0x21,&local_50);
    bVar2 = boost::filesystem::exists(expected_public_key_local);
    boost::test_tools::assertion_result::assertion_result(&local_68,!bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    psVar4 = boost::filesystem::path::string_abi_cxx11_(expected_public_key_local);
    std::operator+(&local_d8,"Private key ",psVar4);
    std::operator+(&local_b8,&local_d8," can\'t be deleted.");
    boost::unit_test::operator<<(&local_88,plVar3,&local_b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
               ,0x8c);
    boost::test_tools::tt_detail::report_assertion(&local_68,&local_88,&local_e8,0x21,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_88);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    boost::test_tools::assertion_result::~assertion_result(&local_68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
               ,0x8c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_f8,0x23,&local_108);
    bVar2 = boost::filesystem::exists(mock_source_folder_local);
    boost::test_tools::assertion_result::assertion_result(&local_120,!bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    psVar4 = boost::filesystem::path::string_abi_cxx11_(mock_source_folder_local);
    std::operator+(&local_180,"Public key ",psVar4);
    std::operator+(&local_160,&local_180," can\'t be deleted.");
    boost::unit_test::operator<<(&local_140,plVar3,&local_160);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)((long)&mock_source.field_2 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
               ,0x8c);
    boost::test_tools::tt_detail::report_assertion
              (&local_120,&local_140,(undefined1 *)((long)&mock_source.field_2 + 8),0x23,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    boost::test_tools::assertion_result::~assertion_result(&local_120);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  psVar4 = boost::filesystem::path::string_abi_cxx11_((path *)project_name_local);
  std::__cxx11::string::string((string *)(projects_str.field_2._M_local_buf + 8),(string *)psVar4);
  psVar4 = boost::filesystem::path::string_abi_cxx11_(expectedPrivateKey_local);
  std::__cxx11::string::string(local_1d0,(string *)psVar4);
  pcStack_228 = "lcc";
  argv1[0] = "project";
  argv1[1] = "init";
  argv1[2] = "-n";
  argv1[3] = (char *)std::__cxx11::string::c_str();
  argv1[4] = "--projects-folder";
  argv1[5] = (char *)std::__cxx11::string::c_str();
  argv1[6] = "--templates";
  argv1[7] = (char *)std::__cxx11::string::c_str();
  local_22c = CommandLineParser::parseCommandLine(9,&stack0xfffffffffffffdd8);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
               ,0x8c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_250);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_240,0x32,&local_250);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_278,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
               ,0x8c);
    local_28c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_278,&local_288,0x32,1,2,&local_22c,"result",&local_28c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_278);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
               ,0x8c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2a0,0x33,&local_2b0);
    bVar2 = boost::filesystem::exists(expected_public_key_local);
    boost::test_tools::assertion_result::assertion_result(&local_2c8,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    psVar4 = boost::filesystem::path::string_abi_cxx11_(expected_public_key_local);
    std::operator+(&local_328,"Private key ",psVar4);
    std::operator+(&local_308,&local_328," created.");
    boost::unit_test::operator<<(&local_2e8,plVar3,&local_308);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
               ,0x8c);
    boost::test_tools::tt_detail::report_assertion(&local_2c8,&local_2e8,&local_338,0x33,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    boost::test_tools::assertion_result::~assertion_result(&local_2c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_348,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
               ,0x8c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_358);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_348,0x34,&local_358);
    bVar2 = boost::filesystem::exists(mock_source_folder_local);
    boost::test_tools::assertion_result::assertion_result(&local_370,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    psVar4 = boost::filesystem::path::string_abi_cxx11_(mock_source_folder_local);
    std::operator+(&local_3d0,"Public key ",psVar4);
    std::operator+(&local_3b0,&local_3d0," created.");
    boost::unit_test::operator<<(&local_390,plVar3,&local_3b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
               ,0x8c);
    boost::test_tools::tt_detail::report_assertion(&local_370,&local_390,&local_3e0,0x34,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    boost::test_tools::assertion_result::~assertion_result(&local_370);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string((string *)(projects_str.field_2._M_local_buf + 8));
  return;
}

Assistant:

static void create_project(const fs::path& projects_folder, const fs::path& expectedPrivateKey,
						   const fs::path& expected_public_key, const fs::path& mock_source_folder,
						   const string& project_name) {
	fs::remove_all(projects_folder);
	BOOST_CHECK_MESSAGE(!fs::exists(expectedPrivateKey),
						"Private key " + expectedPrivateKey.string() + " can't be deleted.");
	BOOST_CHECK_MESSAGE(!fs::exists(expected_public_key),
						"Public key " + expected_public_key.string() + " can't be deleted.");
	const string mock_source = mock_source_folder.string();
	const string projects_str = projects_folder.string();
	int argc = 9;
	const char* argv1[] = {"lcc",
						   "project",
						   "init",
						   "-n",
						   project_name.c_str(),
						   "--projects-folder",
						   projects_str.c_str(),
						   "--templates",
						   mock_source.c_str()};
	// initialize_project
	int result = CommandLineParser::parseCommandLine(argc, argv1);
	BOOST_CHECK_EQUAL(result, 0);
	BOOST_REQUIRE_MESSAGE(fs::exists(expectedPrivateKey), "Private key " + expectedPrivateKey.string() + " created.");
	BOOST_CHECK_MESSAGE(fs::exists(expected_public_key), "Public key " + expected_public_key.string() + " created.");
}